

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

uint32 __thiscall
Clasp::Solver::countLevels(Solver *this,Literal *first,Literal *last,uint32 maxLevel)

{
  pointer puVar1;
  pointer puVar2;
  uint32 uVar3;
  uint uVar4;
  uint uVar5;
  Literal *pLVar6;
  bool bVar7;
  
  if (maxLevel < 2) {
    uVar4 = (uint)(first != last && maxLevel != 0);
  }
  else {
    if ((this->ccMin_ != (CCMinRecursive *)0x0) && ((this->ccMin_->todo).ebo_.size != 0)) {
      Potassco::fail(-1,
                     "uint32 Clasp::Solver::countLevels(const Literal *, const Literal *, uint32)",
                     0x714,"!ccMin_ || ccMin_->todo.empty()",
                     "Must not be called during minimization!",0);
    }
    uVar3 = incEpoch(this,(this->levels_).super_type.ebo_.size + 1,1);
    if (first == last) {
      uVar4 = 0;
    }
    else {
      puVar1 = (this->assign_).assign_.ebo_.buf;
      puVar2 = (this->epoch_).ebo_.buf;
      uVar4 = 0;
      pLVar6 = first + 1;
      do {
        uVar5 = *(uint *)((long)puVar1 + (ulong)(pLVar6[-1].rep_ & 0xfffffffc)) >> 4;
        if (puVar2[uVar5] == uVar3) {
          bVar7 = false;
        }
        else {
          puVar2[uVar5] = uVar3;
          uVar4 = uVar4 + 1;
          bVar7 = uVar4 == maxLevel;
        }
      } while ((!bVar7) && (bVar7 = pLVar6 != last, pLVar6 = pLVar6 + 1, bVar7));
    }
  }
  return uVar4;
}

Assistant:

uint32 Solver::countLevels(const Literal* first, const Literal* last, uint32 maxLevel) {
	if (maxLevel < 2) { return uint32(maxLevel && first != last); }
	POTASSCO_ASSERT(!ccMin_ || ccMin_->todo.empty(), "Must not be called during minimization!");
	uint32 n = 0;
	for (uint32 epoch = incEpoch(sizeVec(levels_) + 1); first != last; ++first) {
		assert(value(first->var()) != value_free);
		uint32& levEpoch = epoch_[level(first->var())];
		if (levEpoch != epoch) {
			levEpoch = epoch;
			if (++n == maxLevel) { break; }
		}
	}
	return n;
}